

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candidate_index_impl.h
# Opt level: O0

bool __thiscall
candidate_index::CandidateIndex::structural_filter
          (CandidateIndex *this,
          vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
          *r,vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             *s,double t,int olap,int pr,int ps,int distance_threshold,int maxr,int maxs)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference sv_s;
  int local_34;
  int tau_valid;
  int ps_local;
  int pr_local;
  int olap_local;
  double t_local;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  *s_local;
  vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
  *r_local;
  CandidateIndex *this_local;
  
  local_34 = ps;
  tau_valid = pr;
  ps_local = olap;
  while( true ) {
    bVar1 = false;
    if ((t <= (double)maxr) && (bVar1 = false, t <= (double)maxs)) {
      bVar1 = (double)ps_local < t;
    }
    if (!bVar1) break;
    pvVar3 = std::
             vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             ::operator[](r,(long)tau_valid);
    iVar2 = pvVar3->id;
    pvVar3 = std::
             vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             ::operator[](s,(long)local_34);
    if (iVar2 == pvVar3->id) {
      pvVar3 = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](r,(long)tau_valid);
      sv_s = std::
             vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
             ::operator[](s,(long)local_34);
      iVar2 = structural_mapping(this,pvVar3,sv_s,(double)distance_threshold);
      ps_local = iVar2 + ps_local;
      pvVar3 = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](r,(long)tau_valid);
      maxr = maxr - (pvVar3->weight - iVar2);
      pvVar3 = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](s,(long)local_34);
      maxs = maxs - (pvVar3->weight - iVar2);
      tau_valid = tau_valid + 1;
      local_34 = local_34 + 1;
    }
    else {
      pvVar3 = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](r,(long)tau_valid);
      iVar2 = pvVar3->id;
      pvVar3 = std::
               vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
               ::operator[](s,(long)local_34);
      if (iVar2 < pvVar3->id) {
        pvVar3 = std::
                 vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                 ::operator[](r,(long)tau_valid);
        maxr = maxr - pvVar3->weight;
        tau_valid = tau_valid + 1;
      }
      else {
        pvVar3 = std::
                 vector<label_set_converter::LabelSetElement,_std::allocator<label_set_converter::LabelSetElement>_>
                 ::operator[](s,(long)local_34);
        maxs = maxs - pvVar3->weight;
        local_34 = local_34 + 1;
      }
    }
  }
  return t <= (double)ps_local;
}

Assistant:

bool CandidateIndex::structural_filter(
    std::vector<label_set_converter::LabelSetElement>& r, 
    std::vector<label_set_converter::LabelSetElement>& s, 
    const double t, 
    int olap, 
    int pr, 
    int ps, 
    int distance_threshold, 
    int maxr, 
    int maxs) {

  // starting from pr and ps, check if the overlap exceeds the threshold
  // stop if the threshold is reached or cannot be reached anymore
  while (maxr >= t && maxs >= t && olap < t) {
    if (r[pr].id == s[ps].id) {
      int tau_valid = structural_mapping(r[pr], s[ps], distance_threshold);
      olap += tau_valid;
      maxr -= r[pr].weight - tau_valid;
      maxs -= s[ps].weight - tau_valid;
      ++pr; ++ps; 
    } else if (r[pr].id < s[ps].id) {
      maxr -= r[pr].weight;
      ++pr;
    } else {
      maxs -= s[ps].weight;
      ++ps;
    }
  }

  return olap >= t;
}